

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O1

uint32_t * createDFDAlpha(int bigEndian,int bytes,VkSuffix suffix)

{
  int offset;
  size_t __size;
  uint32_t *DFD;
  int sampleNo;
  
  if (bigEndian == 0) {
    DFD = (uint32_t *)malloc(0x2c);
    DFD[0] = 0x2c;
    DFD[1] = 0;
    DFD[2] = 0x280002;
    DFD[3] = (uint)(suffix == s_SRGB) * 0x10000 + 0x10101;
    DFD[4] = 0;
    DFD[5] = bytes;
    DFD[6] = 0;
    writeSample(DFD,0,3,bytes << 3,0,1,1,suffix);
  }
  else {
    __size = (long)(bytes * 4) * 4 + 0x1c;
    DFD = (uint32_t *)malloc(__size);
    *DFD = (uint32_t)__size;
    sampleNo = 0;
    DFD[1] = 0;
    DFD[2] = bytes * 0x100000 + 0x180002;
    DFD[3] = (uint)(suffix == s_SRGB) * 0x10000 + 0x10101;
    DFD[4] = 0;
    DFD[5] = bytes;
    DFD[6] = 0;
    if (0 < bytes) {
      offset = bytes * 8;
      do {
        offset = offset + -8;
        writeSample(DFD,sampleNo,3,8,offset,(uint)(sampleNo - bytes == -1),(uint)(sampleNo == 0),
                    suffix);
        sampleNo = sampleNo + 1;
      } while (sampleNo != bytes);
    }
  }
  return DFD;
}

Assistant:

uint32_t *createDFDAlpha(int bigEndian, int bytes,
                         enum VkSuffix suffix) {
    uint32_t *DFD;
    int channel = 3; /* alpha channel */
    if (bigEndian) {
        int channelByte;
        /* Number of samples = number of channels * bytes per channel */
        DFD = writeHeader(bytes, bytes, suffix, i_COLOR);
        /* Loop over the bytes that constitute a channel */
        for (channelByte = 0; channelByte < bytes; ++channelByte) {
            writeSample(DFD, channelByte, channel,
                        8, 8 * (bytes - channelByte - 1),
                        channelByte == bytes-1, channelByte == 0, suffix);
        }
    } else { /* Little-endian */
        /* One sample per channel */
        DFD = writeHeader(1, bytes, suffix, i_COLOR);
        writeSample(DFD, 0, channel,
                    8 * bytes, 0,
                    1, 1, suffix);
    }
    return DFD;
}